

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glProgramReady(void)

{
  uint uVar1;
  MOJOSHADER_shaderType MVar2;
  MOJOSHADER_uniformType MVar3;
  int iVar4;
  MOJOSHADER_glProgram *pMVar5;
  MOJOSHADER_uniform *pMVar6;
  MOJOSHADER_parseData *pMVar7;
  MOJOSHADER_sampler *pMVar8;
  bool bVar9;
  MOJOSHADER_glContext *pMVar10;
  int iVar11;
  long lVar12;
  int local_e0;
  uint32 local_dc;
  GLfloat *pGStack_d8;
  int texbem_count;
  GLfloat *dstf_1;
  MOJOSHADER_sampler *samps;
  int samp_count;
  MOJOSHADER_parseData *pd;
  size_t i_2;
  uint8 *b;
  size_t count_3;
  GLint *i_1;
  size_t count_2;
  GLfloat *f;
  size_t count_1;
  int size;
  int index;
  MOJOSHADER_uniformType type;
  MOJOSHADER_uniform *u;
  MOJOSHADER_shaderType uniform_shader_type;
  UniformMap *map;
  uint32 i;
  uint8 uniforms_changed;
  GLint *dstb;
  GLint *dsti;
  GLfloat *dstf;
  uint8 *puStack_30;
  MOJOSHADER_shaderType shader_type;
  uint8 *srcb;
  GLint *srci;
  GLfloat *srcf;
  uint32 count;
  MOJOSHADER_glProgram *program;
  
  pMVar5 = ctx->bound_program;
  if (pMVar5 != (MOJOSHADER_glProgram *)0x0) {
    update_enabled_arrays();
    if (pMVar5->uses_pointsize != ctx->pointsize_enabled) {
      if (pMVar5->uses_pointsize == 0) {
        (*ctx->glDisable)(0x8642);
      }
      else {
        (*ctx->glEnable)(0x8642);
      }
      ctx->pointsize_enabled = pMVar5->uses_pointsize;
    }
    if (((pMVar5->uniform_count != 0) || (pMVar5->texbem_count != 0)) &&
       (pMVar5->generation != ctx->generation)) {
      uVar1 = pMVar5->uniform_count;
      srci = (GLint *)ctx->vs_reg_file_f;
      srcb = (uint8 *)ctx->vs_reg_file_i;
      puStack_30 = ctx->vs_reg_file_b;
      dstf._4_4_ = MOJOSHADER_TYPE_VERTEX;
      dsti = (GLint *)pMVar5->vs_uniforms_float4;
      dstb = pMVar5->vs_uniforms_int4;
      _i = pMVar5->vs_uniforms_bool;
      bVar9 = false;
      for (map._0_4_ = 0; (uint)map < uVar1; map._0_4_ = (uint)map + 1) {
        MVar2 = pMVar5->uniforms[(uint)map].shader_type;
        pMVar6 = pMVar5->uniforms[(uint)map].uniform;
        MVar3 = pMVar6->type;
        iVar4 = pMVar6->index;
        if (pMVar6->array_count == 0) {
          local_e0 = 1;
        }
        else {
          local_e0 = pMVar6->array_count;
        }
        if (pMVar6->constant != 0) {
          __assert_fail("!u->constant",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x983,"void MOJOSHADER_glProgramReady(void)");
        }
        if (dstf._4_4_ != MVar2) {
          if (MVar2 != MOJOSHADER_TYPE_PIXEL) {
            __assert_fail("0 && \"Unexpected shader type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x997,"void MOJOSHADER_glProgramReady(void)");
          }
          if (dstf._4_4_ != MOJOSHADER_TYPE_VERTEX) {
            __assert_fail("shader_type == MOJOSHADER_TYPE_VERTEX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x98c,"void MOJOSHADER_glProgramReady(void)");
          }
          srci = (GLint *)ctx->ps_reg_file_f;
          srcb = (uint8 *)ctx->ps_reg_file_i;
          puStack_30 = ctx->ps_reg_file_b;
          dsti = (GLint *)pMVar5->ps_uniforms_float4;
          dstb = pMVar5->ps_uniforms_int4;
          _i = pMVar5->ps_uniforms_bool;
          dstf._4_4_ = MOJOSHADER_TYPE_PIXEL;
        }
        if (MVar3 == MOJOSHADER_UNIFORM_FLOAT) {
          lVar12 = (long)(local_e0 << 2);
          iVar11 = memcmp(dsti,srci + (iVar4 << 2),lVar12 << 2);
          if (iVar11 != 0) {
            memcpy(dsti,srci + (iVar4 << 2),lVar12 << 2);
            bVar9 = true;
          }
          dsti = dsti + lVar12;
        }
        else if (MVar3 == MOJOSHADER_UNIFORM_INT) {
          lVar12 = (long)(local_e0 << 2);
          iVar11 = memcmp(dstb,srcb + (long)(iVar4 << 2) * 4,lVar12 << 2);
          if (iVar11 != 0) {
            memcpy(dstb,srcb + (long)(iVar4 << 2) * 4,lVar12 << 2);
            bVar9 = true;
          }
          dstb = dstb + lVar12;
        }
        else if (MVar3 == MOJOSHADER_UNIFORM_BOOL) {
          for (pd = (MOJOSHADER_parseData *)0x0; pd < (MOJOSHADER_parseData *)(long)local_e0;
              pd = (MOJOSHADER_parseData *)((long)&pd->error_count + 1)) {
            if (_i[(long)pd] != (uint)(puStack_30 + iVar4)[(long)pd]) {
              _i[(long)pd] = (uint)(puStack_30 + iVar4)[(long)pd];
              bVar9 = true;
            }
          }
          _i = _i + local_e0;
        }
      }
      if ((pMVar5->texbem_count != 0) && (pMVar5->fragment == (MOJOSHADER_glShader *)0x0)) {
        __assert_fail("(!program->texbem_count) || (program->fragment)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x9c4,"void MOJOSHADER_glProgramReady(void)");
      }
      if ((pMVar5->texbem_count != 0) && (pMVar5->fragment != (MOJOSHADER_glShader *)0x0)) {
        pMVar7 = pMVar5->fragment->parseData;
        uVar1 = pMVar7->sampler_count;
        pMVar8 = pMVar7->samplers;
        local_dc = 0;
        pGStack_d8 = pMVar5->ps_uniforms_float4 +
                     (pMVar5->ps_uniforms_float4_count * 4 - (ulong)(pMVar5->texbem_count << 3));
        if (3 < pMVar5->texbem_count) {
          __assert_fail("program->texbem_count <= MAX_TEXBEMS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x9d0,"void MOJOSHADER_glProgramReady(void)");
        }
        for (map._0_4_ = 0; pMVar10 = ctx, (uint)map < uVar1; map._0_4_ = (uint)map + 1) {
          if (pMVar8[(uint)map].texbem != 0) {
            if (pMVar8[(uint)map].index < 1) {
              __assert_fail("samps[i].index > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d5,"void MOJOSHADER_glProgramReady(void)");
            }
            if (3 < pMVar8[(uint)map].index) {
              __assert_fail("samps[i].index <= MAX_TEXBEMS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d6,"void MOJOSHADER_glProgramReady(void)");
            }
            lVar12 = (long)((pMVar8[(uint)map].index + -1) * 6);
            *(undefined8 *)pGStack_d8 = *(undefined8 *)(ctx->texbem_state + lVar12);
            *(undefined8 *)(pGStack_d8 + 2) = *(undefined8 *)(pMVar10->texbem_state + lVar12 + 2);
            *(undefined8 *)(pGStack_d8 + 4) = *(undefined8 *)(pMVar10->texbem_state + lVar12 + 4);
            pGStack_d8[6] = 0.0;
            pGStack_d8[7] = 0.0;
            pGStack_d8 = pGStack_d8 + 8;
            local_dc = local_dc + 1;
          }
        }
        if (local_dc != pMVar5->texbem_count) {
          __assert_fail("texbem_count == program->texbem_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x9e0,"void MOJOSHADER_glProgramReady(void)");
        }
      }
      pMVar5->generation = ctx->generation;
      if (bVar9) {
        (*ctx->profilePushUniforms)();
      }
    }
  }
  return;
}

Assistant:

void MOJOSHADER_glProgramReady(void)
{
    MOJOSHADER_glProgram *program = ctx->bound_program;

    if (program == NULL)
        return;  // nothing to do.

    // Toggle vertex attribute arrays on/off, based on our needs.
    update_enabled_arrays();

    if (program->uses_pointsize != ctx->pointsize_enabled)
    {
        if (program->uses_pointsize)
            ctx->glEnable(GL_PROGRAM_POINT_SIZE);
        else
            ctx->glDisable(GL_PROGRAM_POINT_SIZE);
        ctx->pointsize_enabled = program->uses_pointsize;
    } // if

    // push Uniforms to the program from our register files...
    if ( ((program->uniform_count) || (program->texbem_count)) &&
         (program->generation != ctx->generation))
    {
        // vertex shader uniforms come first in program->uniforms array.
        const uint32 count = program->uniform_count;
        const GLfloat *srcf = ctx->vs_reg_file_f;
        const GLint *srci = ctx->vs_reg_file_i;
        const uint8 *srcb = ctx->vs_reg_file_b;
        MOJOSHADER_shaderType shader_type = MOJOSHADER_TYPE_VERTEX;
        GLfloat *dstf = program->vs_uniforms_float4;
        GLint *dsti = program->vs_uniforms_int4;
        GLint *dstb = program->vs_uniforms_bool;
        uint8 uniforms_changed = 0;
        uint32 i;

        for (i = 0; i < count; i++)
        {
            UniformMap *map = &program->uniforms[i];
            const MOJOSHADER_shaderType uniform_shader_type = map->shader_type;
            const MOJOSHADER_uniform *u = map->uniform;
            const MOJOSHADER_uniformType type = u->type;
            const int index = u->index;
            const int size = u->array_count ? u->array_count : 1;

            assert(!u->constant);

            // Did we switch from vertex to pixel (to geometry, etc)?
            if (shader_type != uniform_shader_type)
            {
                // we start with vertex, move to pixel, then to geometry, etc.
                //  The array should always be sorted as such.
                if (uniform_shader_type == MOJOSHADER_TYPE_PIXEL)
                {
                    assert(shader_type == MOJOSHADER_TYPE_VERTEX);
                    srcf = ctx->ps_reg_file_f;
                    srci = ctx->ps_reg_file_i;
                    srcb = ctx->ps_reg_file_b;
                    dstf = program->ps_uniforms_float4;
                    dsti = program->ps_uniforms_int4;
                    dstb = program->ps_uniforms_bool;
                } // if
                else
                {
                    // Should be ordered vertex, then pixel, then geometry.
                    assert(0 && "Unexpected shader type");
                } // else

                shader_type = uniform_shader_type;
            } // if

            if (type == MOJOSHADER_UNIFORM_FLOAT)
            {
                const size_t count = 4 * size;
                const GLfloat *f = &srcf[index * 4];
                if (memcmp(dstf, f, sizeof (GLfloat) * count) != 0)
                {
                    memcpy(dstf, f, sizeof (GLfloat) * count);
                    uniforms_changed = 1;
                }
                dstf += count;
            } // if
            else if (type == MOJOSHADER_UNIFORM_INT)
            {
                const size_t count = 4 * size;
                const GLint *i = &srci[index * 4];
                if (memcmp(dsti, i, sizeof (GLint) * count) != 0)
                {
                    memcpy(dsti, i, sizeof (GLint) * count);
                    uniforms_changed = 1;
                } // if
                dsti += count;
            } // else if
            else if (type == MOJOSHADER_UNIFORM_BOOL)
            {
                const size_t count = size;
                const uint8 *b = &srcb[index];
                size_t i;
                for (i = 0; i < count; i++)
                    if (dstb[i] != b[i])
                    {
                        dstb[i] = (GLint) b[i];
                        uniforms_changed = 1;
                    } // if
                dstb += count;
            } // else if

            // !!! FIXME: set constants that overlap the array.
        } // for

        assert((!program->texbem_count) || (program->fragment));
        if ((program->texbem_count) && (program->fragment))
        {
            const MOJOSHADER_parseData *pd = program->fragment->parseData;
            const int samp_count = pd->sampler_count;
            const MOJOSHADER_sampler *samps = pd->samplers;
            GLfloat *dstf = program->ps_uniforms_float4;
            int texbem_count = 0;

            dstf += (program->ps_uniforms_float4_count * 4) -
                     (program->texbem_count * 8);

            assert(program->texbem_count <= MAX_TEXBEMS);
            for (i = 0; i < samp_count; i++)
            {
                if (samps[i].texbem)
                {
                    assert(samps[i].index > 0);
                    assert(samps[i].index <= MAX_TEXBEMS);
                    memcpy(dstf, &ctx->texbem_state[6 * (samps[i].index-1)],
                           sizeof (GLfloat) * 6);
                    dstf[6] = 0.0f;
                    dstf[7] = 0.0f;
                    dstf += 8;
                    texbem_count++;
                } // if
            } // for

            assert(texbem_count == program->texbem_count);
        } // if

        program->generation = ctx->generation;

        if (uniforms_changed)
            ctx->profilePushUniforms();
    } // if
}